

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O3

BigInt * extended_gcd(BigInt *__return_storage_ptr__,BigInt *a,BigInt *b,BigInt *x,BigInt *y)

{
  pointer plVar1;
  bool bVar2;
  BigInt local_70;
  BigInt local_50;
  
  BigInt::BigInt(&local_70,0);
  bVar2 = BigInt::operator==(b,&local_70);
  if (local_70.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (bVar2) {
    BigInt::operator=(x,1);
    y->sign = 1;
    plVar1 = (y->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((y->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish != plVar1) {
      (y->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish = plVar1;
    }
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&__return_storage_ptr__->vector_value,&a->vector_value);
    __return_storage_ptr__->sign = a->sign;
  }
  else {
    BigInt::operator%(&local_70,a,b);
    extended_gcd(__return_storage_ptr__,b,&local_70,y,x);
    if (local_70.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.vector_value.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    BigInt::operator/(&local_50,a,b);
    BigInt::operator*(&local_70,&local_50,x);
    BigInt::operator-=(y,&local_70);
    if (local_70.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.vector_value.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_50.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.vector_value.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt extended_gcd(const BigInt &a, const BigInt &b, BigInt &x, BigInt &y) {
    if (b == BigInt(0)) //!check on b for the zero division
    {
        x = 1, y = 0; //! a*1 + b *0 = gcd(a,0) =  a
        return a;
    }

    BigInt g = extended_gcd(b, a % b, y, x); //! b, a % b order for infinite loops
    y -= (a / b) * x;//!Ynew= Xold - (a/b) * Yold , Xnew=Yold
    return g;
}